

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O0

int __thiscall
jrtplib::
RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,_8317>
::AddElement(RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,_8317>
             *this,RTPIPv4Destination *elem)

{
  HashElement *pHVar1;
  bool bVar2;
  bool bVar3;
  int index_00;
  RTPIPv4Destination *this_00;
  RTPMemoryManager *mgr;
  HashElement *this_01;
  HashElement *newelem;
  HashElement *e;
  bool found;
  int index;
  RTPIPv4Destination *elem_local;
  RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPUDPv4Trans_GetHashIndex_IPv4Dest,_8317>
  *this_local;
  
  index_00 = RTPUDPv4Trans_GetHashIndex_IPv4Dest::GetIndex(elem);
  if (index_00 < 0x207d) {
    newelem = this->table[index_00];
    bVar2 = false;
    while (!bVar2 && newelem != (HashElement *)0x0) {
      this_00 = HashElement::GetElement(newelem);
      bVar3 = RTPIPv4Destination::operator==(this_00,elem);
      if (bVar3) {
        bVar2 = true;
      }
      else {
        newelem = newelem->hashnext;
      }
    }
    if (bVar2) {
      this_local._4_4_ = -4;
    }
    else {
      mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
      this_01 = (HashElement *)operator_new(0x48,mgr,this->memorytype);
      HashElement::HashElement(this_01,elem,index_00);
      if (this_01 == (HashElement *)0x0) {
        this_local._4_4_ = -1;
      }
      else {
        pHVar1 = this->table[index_00];
        this->table[index_00] = this_01;
        this_01->hashnext = pHVar1;
        if (pHVar1 != (HashElement *)0x0) {
          pHVar1->hashprev = this_01;
        }
        if (this->firsthashelem == (HashElement *)0x0) {
          this->firsthashelem = this_01;
          this->lasthashelem = this_01;
        }
        else {
          this->lasthashelem->listnext = this_01;
          this_01->listprev = this->lasthashelem;
          this->lasthashelem = this_01;
        }
        this_local._4_4_ = 0;
      }
    }
  }
  else {
    this_local._4_4_ = -6;
  }
  return this_local._4_4_;
}

Assistant:

inline int RTPHashTable<Element,GetIndex,hashsize>::AddElement(const Element &elem)
{
	int index;
	bool found;
	HashElement *e,*newelem;
	
	index = GetIndex::GetIndex(elem);
	if (index >= hashsize)
		return ERR_RTP_HASHTABLE_FUNCTIONRETURNEDINVALIDHASHINDEX;
	
	e = table[index];
	found = false;
	while(!found && e != 0)
	{
		if (e->GetElement() == elem)
			found = true;
		else
			e = e->hashnext;
	}
	if (found)
		return ERR_RTP_HASHTABLE_ELEMENTALREADYEXISTS;
	
	// Okay, the key doesn't exist, so we can add the new element in the hash table
	
	newelem = RTPNew(GetMemoryManager(),memorytype) HashElement(elem,index);
	if (newelem == 0)
		return ERR_RTP_OUTOFMEM;

	e = table[index];
	table[index] = newelem;
	newelem->hashnext = e;
	if (e != 0)
		e->hashprev = newelem;
	
	// Now, we still got to add it to the linked list
	
	if (firsthashelem == 0)
	{
		firsthashelem = newelem;
		lasthashelem = newelem;
	}
	else // there already are some elements in the list
	{
		lasthashelem->listnext = newelem;
		newelem->listprev = lasthashelem;
		lasthashelem = newelem;
	}
	return 0;
}